

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O3

void * tommy_trie_remove(tommy_trie *trie,tommy_key_t key)

{
  long lVar1;
  tommy_trie_node *ptVar2;
  tommy_key_t in_R8D;
  void *pvVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar3 = (void *)0x0;
  ptVar2 = trie_bucket_remove_existing
                     (trie,(int)trie + (key >> 0x1b) * 8,(tommy_trie_node **)0x0,
                      (tommy_trie_node *)(ulong)key,in_R8D);
  if (ptVar2 != (tommy_trie_node *)0x0) {
    trie->count = trie->count - 1;
    pvVar3 = ptVar2->data;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_trie_remove(tommy_trie* trie, tommy_key_t key)
{
	tommy_trie_node* ret;
	tommy_trie_node** let_ptr;

	let_ptr = &trie->bucket[key >> TOMMY_TRIE_BUCKET_SHIFT];

	ret = trie_bucket_remove_existing(trie, TOMMY_TRIE_BUCKET_SHIFT, let_ptr, 0, key);

	if (!ret)
		return 0;

	--trie->count;

	return ret->data;
}